

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O3

int __thiscall ncnn::InstanceNorm::load_model(InstanceNorm *this,ModelBin *mb)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  int iVar4;
  void *local_60;
  int *local_58;
  size_t local_50;
  int local_48;
  Allocator *local_40;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  size_t local_28;
  
  (*mb->_vptr_ModelBin[2])(&local_60,mb,(ulong)(uint)this->channels,1);
  if (&this->gamma_data != (Mat *)&local_60) {
    if (local_58 != (int *)0x0) {
      LOCK();
      *local_58 = *local_58 + 1;
      UNLOCK();
    }
    piVar1 = (this->gamma_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->gamma_data).data;
        pAVar3 = (this->gamma_data).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 0x18))();
        }
      }
    }
    (this->gamma_data).data = local_60;
    (this->gamma_data).refcount = local_58;
    (this->gamma_data).elemsize = local_50;
    (this->gamma_data).elempack = local_48;
    (this->gamma_data).allocator = local_40;
    (this->gamma_data).dims = local_38;
    (this->gamma_data).w = iStack_34;
    (this->gamma_data).h = iStack_30;
    (this->gamma_data).c = iStack_2c;
    (this->gamma_data).cstep = local_28;
  }
  if (local_58 != (int *)0x0) {
    LOCK();
    *local_58 = *local_58 + -1;
    UNLOCK();
    if (*local_58 == 0) {
      if (local_40 == (Allocator *)0x0) {
        if (local_60 != (void *)0x0) {
          free(local_60);
        }
      }
      else {
        (**(code **)(*(long *)local_40 + 0x18))();
      }
    }
  }
  iVar4 = -100;
  if (((this->gamma_data).data != (void *)0x0) &&
     ((long)(this->gamma_data).c * (this->gamma_data).cstep != 0)) {
    (*mb->_vptr_ModelBin[2])(&local_60,mb,(ulong)(uint)this->channels,1);
    if (&this->beta_data != (Mat *)&local_60) {
      if (local_58 != (int *)0x0) {
        LOCK();
        *local_58 = *local_58 + 1;
        UNLOCK();
      }
      piVar1 = (this->beta_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = (this->beta_data).data;
          pAVar3 = (this->beta_data).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (**(code **)(*(long *)pAVar3 + 0x18))();
          }
        }
      }
      (this->beta_data).data = local_60;
      (this->beta_data).refcount = local_58;
      (this->beta_data).elemsize = local_50;
      (this->beta_data).elempack = local_48;
      (this->beta_data).allocator = local_40;
      (this->beta_data).dims = local_38;
      (this->beta_data).w = iStack_34;
      (this->beta_data).h = iStack_30;
      (this->beta_data).c = iStack_2c;
      (this->beta_data).cstep = local_28;
    }
    if (local_58 != (int *)0x0) {
      LOCK();
      *local_58 = *local_58 + -1;
      UNLOCK();
      if (*local_58 == 0) {
        if (local_40 == (Allocator *)0x0) {
          if (local_60 != (void *)0x0) {
            free(local_60);
          }
        }
        else {
          (**(code **)(*(long *)local_40 + 0x18))();
        }
      }
    }
    if (((this->beta_data).data == (void *)0x0) ||
       (iVar4 = 0, (long)(this->beta_data).c * (this->beta_data).cstep == 0)) {
      iVar4 = -100;
    }
  }
  return iVar4;
}

Assistant:

int InstanceNorm::load_model(const ModelBin& mb)
{
    gamma_data = mb.load(channels, 1);
    if (gamma_data.empty())
        return -100;

    beta_data = mb.load(channels, 1);
    if (beta_data.empty())
        return -100;

    return 0;
}